

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

void AddNewRoom(void)

{
  Admin *this;
  Room *this_00;
  uint local_18;
  int local_14;
  int access;
  int id;
  char *name;
  
  _access = (char *)operator_new__(100);
  std::operator<<((ostream *)&std::cout,"Room Name : \n");
  std::operator>>((basic_istream<char,_std::char_traits<char>_> *)&std::cin,_access);
  std::operator<<((ostream *)&std::cout,"Room number : \n");
  std::istream::operator>>((istream *)&std::cin,&local_14);
  std::operator<<((ostream *)&std::cout,"Standard Access level for Room : \n");
  std::istream::operator>>((istream *)&std::cin,(int *)&local_18);
  this = root;
  this_00 = (Room *)operator_new(0x28);
  Room::Room(this_00,_access,local_14,local_18);
  Admin::addNewRoom(this,this_00);
  return;
}

Assistant:

void AddNewRoom(){
    char* name = new char[100];
    cout<<"Room Name : \n";
    cin>>name;
    int id;
    cout<<"Room number : \n";
    cin>>id;
    int access;
    cout<<"Standard Access level for Room : \n";
    cin>>access;
    root->addNewRoom(new Room(name,id,access));
}